

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O3

SpatialInertia * __thiscall
iDynTree::Transform::operator*
          (SpatialInertia *__return_storage_ptr__,Transform *this,SpatialInertia *op2)

{
  Rotation *this_00;
  SpatialInertia *pSVar1;
  Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> newI;
  Position newCenterOfMass;
  RotationalInertia oldRotInertiaWrtCom;
  RotationalInertia newRotInertia;
  assign_op<double,_double> local_1c9;
  double local_1c8;
  SpatialInertia *local_1c0;
  RotationalInertia *local_1b8 [2];
  Vector3d local_1a8;
  Position local_188;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_168;
  Matrix<double,_3,_3,_0,_3,_3> local_108;
  RotationalInertia local_c0;
  RotationalInertia local_78;
  
  local_1c0 = __return_storage_ptr__;
  local_1c8 = SpatialInertia::getMass(op2);
  SpatialInertia::getCenterOfMass((Position *)&local_78,op2);
  this_00 = &this->rot;
  Rotation::operator*((Position *)&local_168,this_00,(Position *)&local_78);
  Position::operator+(&local_188,(Position *)&local_168,&this->pos);
  RotationalInertia::RotationalInertia(&local_78);
  local_1b8[0] = &local_78;
  SpatialInertia::getRotationalInertiaWrtCenterOfMass(&local_c0,op2);
  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_188.super_Vector3.m_data[0];
  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_188.super_Vector3.m_data[1];
  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_188.super_Vector3.m_data[2];
  squareCrossProductMatrix(&local_1a8);
  local_168.m_rhs.m_lhs.m_functor.m_other = local_1c8;
  local_168.m_lhs.m_lhs.m_lhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this_00;
  local_168.m_lhs.m_lhs.m_rhs.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)&local_c0;
  local_168.m_lhs.m_rhs.m_matrix.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)this_00;
  local_168.m_rhs.m_rhs = &local_108;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,3,0,3,3>const,0,Eigen::Stride<0,0>>,0>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>,Eigen::internal::assign_op<double,double>>
            ((Map<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0,_Eigen::Stride<0,_0>_> *)local_1b8,
             &local_168,&local_1c9);
  pSVar1 = local_1c0;
  SpatialInertia::SpatialInertia(local_1c0,local_1c8,&local_188,&local_78);
  return pSVar1;
}

Assistant:

SpatialInertia Transform::operator*(const SpatialInertia& op2) const
{
    return transform<SpatialInertia>(*this,op2);
}